

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wu32_width(OutputFile *this,uint32_t n,int w)

{
  _Setw _Var1;
  ostream *poVar2;
  int w_local;
  uint32_t n_local;
  OutputFile *this_local;
  
  poVar2 = stream(this);
  _Var1 = std::setw(w);
  std::operator<<(poVar2,_Var1);
  poVar2 = stream(this);
  std::ostream::operator<<(poVar2,n);
  return this;
}

Assistant:

OutputFile & OutputFile::wu32_width (uint32_t n, int w)
{
	stream () << std::setw (w);
	stream () << n;
	return *this;
}